

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase106::run(TestCase106 *this)

{
  bool bVar1;
  uint64_t uVar2;
  bool local_601;
  undefined1 auStack_600 [7];
  bool _kj_shouldLog_12;
  Maybe<capnp::StructSchema::Field> local_5f0;
  bool local_5a1;
  undefined1 auStack_5a0 [7];
  bool _kj_shouldLog_11;
  Maybe<capnp::StructSchema::Field> local_590;
  bool local_541;
  undefined1 auStack_540 [7];
  bool _kj_shouldLog_10;
  Maybe<capnp::StructSchema::Field> local_530;
  bool local_4e1;
  undefined1 auStack_4e0 [7];
  bool _kj_shouldLog_9;
  Maybe<capnp::StructSchema::Field> local_4d0;
  bool local_481;
  undefined1 auStack_480 [7];
  bool _kj_shouldLog_8;
  Maybe<capnp::StructSchema::Field> local_470;
  bool local_421;
  undefined1 auStack_420 [7];
  bool _kj_shouldLog_7;
  Maybe<capnp::StructSchema::Field> local_410;
  bool local_3c1;
  undefined1 auStack_3c0 [7];
  bool _kj_shouldLog_6;
  Maybe<capnp::StructSchema::Field> local_3b0;
  bool local_361;
  Schema SStack_360;
  bool _kj_shouldLog_5;
  Reader local_358;
  ArrayPtr<const_char> local_328;
  bool local_311;
  undefined1 local_310 [7];
  bool _kj_shouldLog_4;
  ArrayPtr<const_char> local_2e0;
  ArrayPtr<const_char> local_2d0;
  undefined1 local_2c0 [8];
  Field u1f0s8;
  undefined1 auStack_278 [7];
  bool _kj_shouldLog_3;
  Maybe<capnp::StructSchema::Field> local_268;
  Reader local_220;
  Schema local_1f0;
  bool local_1e1;
  undefined1 local_1e0 [7];
  bool _kj_shouldLog_2;
  Schema local_1b0;
  Reader local_1a8;
  Reader local_178;
  Schema local_148;
  Schema local_140;
  StructSchema union1g;
  undefined1 local_128 [8];
  Field union1;
  undefined1 auStack_e0 [7];
  bool _kj_shouldLog_1;
  Maybe<capnp::StructSchema::Field> local_d0;
  bool local_85;
  bool _kj_shouldLog;
  ArrayPtr<const_char> local_78;
  Maybe<capnp::StructSchema::Field> local_68;
  Schema local_20;
  Schema local_18;
  StructSchema schema;
  TestCase106 *this_local;
  
  schema.super_Schema.raw = (Schema)(Schema)this;
  local_20.raw = (RawBrandedSchema *)Schema::from<capnproto_test::capnp::test::TestUnion>();
  local_18.raw = (RawBrandedSchema *)Schema::asStruct(&local_20);
  kj::StringPtr::StringPtr((StringPtr *)&local_78,"bit0");
  StructSchema::findFieldByName(&local_68,(StructSchema *)&local_18,(StringPtr)local_78);
  bVar1 = kj::Maybe<capnp::StructSchema::Field>::operator!=(&local_68,(void *)0x0);
  kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_68);
  if (!bVar1) {
    local_85 = kj::_::Debug::shouldLog(ERROR);
    while (local_85 != false) {
      kj::_::Debug::log<char_const(&)[59]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x6d,ERROR,
                 "\"failed: expected \" \"schema.findFieldByName(\\\"bit0\\\") != nullptr\"",
                 (char (*) [59])"failed: expected schema.findFieldByName(\"bit0\") != nullptr");
      local_85 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_e0,"u1f0s8");
  StructSchema::findFieldByName(&local_d0,(StructSchema *)&local_18,(StringPtr)_auStack_e0);
  bVar1 = kj::Maybe<capnp::StructSchema::Field>::operator==(&local_d0,(void *)0x0);
  kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_d0);
  if (!bVar1) {
    union1.proto._reader._47_1_ = kj::_::Debug::shouldLog(ERROR);
    while (union1.proto._reader._47_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[61]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x6e,ERROR,
                 "\"failed: expected \" \"schema.findFieldByName(\\\"u1f0s8\\\") == nullptr\"",
                 (char (*) [61])"failed: expected schema.findFieldByName(\"u1f0s8\") == nullptr");
      union1.proto._reader._47_1_ = 0;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)&union1g,"union1");
  StructSchema::getFieldByName((Field *)local_128,(StructSchema *)&local_18,(StringPtr)_union1g);
  StructSchema::Field::getProto(&local_1a8,(Field *)local_128);
  capnp::schema::Field::Reader::getGroup(&local_178,&local_1a8);
  uVar2 = capnp::schema::Field::Group::Reader::getTypeId(&local_178);
  local_148 = Schema::getDependency(&local_18,uVar2);
  local_140.raw = (RawBrandedSchema *)Schema::asStruct(&local_148);
  Schema::getProto((Reader *)local_1e0,&local_140);
  uVar2 = capnp::schema::Node::Reader::getScopeId((Reader *)local_1e0);
  local_1b0 = Schema::getDependency(&local_140,uVar2);
  bVar1 = Schema::operator==(&local_18,&local_1b0);
  if (!bVar1) {
    local_1e1 = kj::_::Debug::shouldLog(ERROR);
    while (local_1e1 != false) {
      Schema::getProto(&local_220,&local_140);
      uVar2 = capnp::schema::Node::Reader::getScopeId(&local_220);
      local_1f0 = Schema::getDependency(&local_140,uVar2);
      kj::_::Debug::log<char_const(&)[86],capnp::StructSchema&,capnp::Schema>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x72,ERROR,
                 "\"failed: expected \" \"(schema) == (union1g.getDependency(union1g.getProto().getScopeId()))\", schema, union1g.getDependency(union1g.getProto().getScopeId())"
                 ,(char (*) [86])
                  "failed: expected (schema) == (union1g.getDependency(union1g.getProto().getScopeId()))"
                 ,(StructSchema *)&local_18,&local_1f0);
      local_1e1 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_278,"bin0");
  StructSchema::findFieldByName(&local_268,(StructSchema *)&local_140,(StringPtr)_auStack_278);
  bVar1 = kj::Maybe<capnp::StructSchema::Field>::operator==(&local_268,(void *)0x0);
  kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_268);
  if (!bVar1) {
    u1f0s8.proto._reader._47_1_ = kj::_::Debug::shouldLog(ERROR);
    while (u1f0s8.proto._reader._47_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[60]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x73,ERROR,
                 "\"failed: expected \" \"union1g.findFieldByName(\\\"bin0\\\") == nullptr\"",
                 (char (*) [60])"failed: expected union1g.findFieldByName(\"bin0\") == nullptr");
      u1f0s8.proto._reader._47_1_ = 0;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)&local_2d0,"u1f0s8");
  StructSchema::getFieldByName((Field *)local_2c0,(StructSchema *)&local_140,(StringPtr)local_2d0);
  StructSchema::Field::getProto((Reader *)local_310,(Field *)local_2c0);
  local_2e0 = (ArrayPtr<const_char>)capnp::schema::Field::Reader::getName((Reader *)local_310);
  bVar1 = kj::operator==("u1f0s8",(StringPtr *)&local_2e0);
  if (!bVar1) {
    local_311 = kj::_::Debug::shouldLog(ERROR);
    while (local_311 != false) {
      StructSchema::Field::getProto(&local_358,(Field *)local_2c0);
      local_328 = (ArrayPtr<const_char>)capnp::schema::Field::Reader::getName(&local_358);
      kj::_::Debug::log<char_const(&)[61],char_const(&)[7],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x76,ERROR,
                 "\"failed: expected \" \"(\\\"u1f0s8\\\") == (u1f0s8.getProto().getName())\", \"u1f0s8\", u1f0s8.getProto().getName()"
                 ,(char (*) [61])"failed: expected (\"u1f0s8\") == (u1f0s8.getProto().getName())",
                 (char (*) [7])"u1f0s8",(Reader *)&local_328);
      local_311 = false;
    }
  }
  SStack_360.raw = (RawBrandedSchema *)StructSchema::Field::getContainingStruct((Field *)local_2c0);
  bVar1 = Schema::operator==(&stack0xfffffffffffffca0,&local_140);
  if (!bVar1) {
    local_361 = kj::_::Debug::shouldLog(ERROR);
    while (local_361 != false) {
      kj::_::Debug::log<char_const(&)[57]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x77,ERROR,"\"failed: expected \" \"u1f0s8.getContainingStruct() == union1g\"",
                 (char (*) [57])"failed: expected u1f0s8.getContainingStruct() == union1g");
      local_361 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_3c0,"u1f1s8");
  StructSchema::findFieldByName(&local_3b0,(StructSchema *)&local_140,(StringPtr)_auStack_3c0);
  bVar1 = kj::Maybe<capnp::StructSchema::Field>::operator!=(&local_3b0,(void *)0x0);
  kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_3b0);
  if (!bVar1) {
    local_3c1 = kj::_::Debug::shouldLog(ERROR);
    while (local_3c1 != false) {
      kj::_::Debug::log<char_const(&)[62]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x79,ERROR,
                 "\"failed: expected \" \"union1g.findFieldByName(\\\"u1f1s8\\\") != nullptr\"",
                 (char (*) [62])"failed: expected union1g.findFieldByName(\"u1f1s8\") != nullptr");
      local_3c1 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_420,"u1f0s32");
  StructSchema::findFieldByName(&local_410,(StructSchema *)&local_140,(StringPtr)_auStack_420);
  bVar1 = kj::Maybe<capnp::StructSchema::Field>::operator!=(&local_410,(void *)0x0);
  kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_410);
  if (!bVar1) {
    local_421 = kj::_::Debug::shouldLog(ERROR);
    while (local_421 != false) {
      kj::_::Debug::log<char_const(&)[63]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x7a,ERROR,
                 "\"failed: expected \" \"union1g.findFieldByName(\\\"u1f0s32\\\") != nullptr\"",
                 (char (*) [63])"failed: expected union1g.findFieldByName(\"u1f0s32\") != nullptr");
      local_421 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_480,"u1f0sp");
  StructSchema::findFieldByName(&local_470,(StructSchema *)&local_140,(StringPtr)_auStack_480);
  bVar1 = kj::Maybe<capnp::StructSchema::Field>::operator!=(&local_470,(void *)0x0);
  kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_470);
  if (!bVar1) {
    local_481 = kj::_::Debug::shouldLog(ERROR);
    while (local_481 != false) {
      kj::_::Debug::log<char_const(&)[62]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x7b,ERROR,
                 "\"failed: expected \" \"union1g.findFieldByName(\\\"u1f0sp\\\") != nullptr\"",
                 (char (*) [62])"failed: expected union1g.findFieldByName(\"u1f0sp\") != nullptr");
      local_481 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_4e0,"u1f1s1");
  StructSchema::findFieldByName(&local_4d0,(StructSchema *)&local_140,(StringPtr)_auStack_4e0);
  bVar1 = kj::Maybe<capnp::StructSchema::Field>::operator!=(&local_4d0,(void *)0x0);
  kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_4d0);
  if (!bVar1) {
    local_4e1 = kj::_::Debug::shouldLog(ERROR);
    while (local_4e1 != false) {
      kj::_::Debug::log<char_const(&)[62]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x7c,ERROR,
                 "\"failed: expected \" \"union1g.findFieldByName(\\\"u1f1s1\\\") != nullptr\"",
                 (char (*) [62])"failed: expected union1g.findFieldByName(\"u1f1s1\") != nullptr");
      local_4e1 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_540,"u0f0s1");
  StructSchema::findFieldByName(&local_530,(StructSchema *)&local_140,(StringPtr)_auStack_540);
  bVar1 = kj::Maybe<capnp::StructSchema::Field>::operator==(&local_530,(void *)0x0);
  kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_530);
  if (!bVar1) {
    local_541 = kj::_::Debug::shouldLog(ERROR);
    while (local_541 != false) {
      kj::_::Debug::log<char_const(&)[62]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x7e,ERROR,
                 "\"failed: expected \" \"union1g.findFieldByName(\\\"u0f0s1\\\") == nullptr\"",
                 (char (*) [62])"failed: expected union1g.findFieldByName(\"u0f0s1\") == nullptr");
      local_541 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_5a0,"u2f0s8");
  StructSchema::findFieldByName(&local_590,(StructSchema *)&local_140,(StringPtr)_auStack_5a0);
  bVar1 = kj::Maybe<capnp::StructSchema::Field>::operator==(&local_590,(void *)0x0);
  kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_590);
  if (!bVar1) {
    local_5a1 = kj::_::Debug::shouldLog(ERROR);
    while (local_5a1 != false) {
      kj::_::Debug::log<char_const(&)[62]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x7f,ERROR,
                 "\"failed: expected \" \"union1g.findFieldByName(\\\"u2f0s8\\\") == nullptr\"",
                 (char (*) [62])"failed: expected union1g.findFieldByName(\"u2f0s8\") == nullptr");
      local_5a1 = false;
    }
  }
  kj::StringPtr::StringPtr((StringPtr *)auStack_600,"noSuchField");
  StructSchema::findFieldByName(&local_5f0,(StructSchema *)&local_140,(StringPtr)_auStack_600);
  bVar1 = kj::Maybe<capnp::StructSchema::Field>::operator==(&local_5f0,(void *)0x0);
  kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_5f0);
  if (!bVar1) {
    local_601 = kj::_::Debug::shouldLog(ERROR);
    while (local_601 != false) {
      kj::_::Debug::log<char_const(&)[67]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x80,ERROR,
                 "\"failed: expected \" \"union1g.findFieldByName(\\\"noSuchField\\\") == nullptr\""
                 ,(char (*) [67])
                  "failed: expected union1g.findFieldByName(\"noSuchField\") == nullptr");
      local_601 = false;
    }
  }
  return;
}

Assistant:

TEST(Schema, Unions) {
  auto schema = Schema::from<TestUnion>().asStruct();

  EXPECT_TRUE(schema.findFieldByName("bit0") != nullptr);
  EXPECT_TRUE(schema.findFieldByName("u1f0s8") == nullptr);

  auto union1 = schema.getFieldByName("union1");
  auto union1g = schema.getDependency(union1.getProto().getGroup().getTypeId()).asStruct();
  EXPECT_EQ(schema, union1g.getDependency(union1g.getProto().getScopeId()));
  EXPECT_TRUE(union1g.findFieldByName("bin0") == nullptr);

  auto u1f0s8 = union1g.getFieldByName("u1f0s8");
  EXPECT_EQ("u1f0s8", u1f0s8.getProto().getName());
  EXPECT_TRUE(u1f0s8.getContainingStruct() == union1g);

  EXPECT_TRUE(union1g.findFieldByName("u1f1s8") != nullptr);
  EXPECT_TRUE(union1g.findFieldByName("u1f0s32") != nullptr);
  EXPECT_TRUE(union1g.findFieldByName("u1f0sp") != nullptr);
  EXPECT_TRUE(union1g.findFieldByName("u1f1s1") != nullptr);

  EXPECT_TRUE(union1g.findFieldByName("u0f0s1") == nullptr);
  EXPECT_TRUE(union1g.findFieldByName("u2f0s8") == nullptr);
  EXPECT_TRUE(union1g.findFieldByName("noSuchField") == nullptr);
}